

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionBytecodeDirectCompiler_compileASTNode
          (sysbvm_context_t *context,sysbvm_functionBytecodeDirectCompiler_t *compiler_,
          sysbvm_tuple_t astNode_)

{
  undefined8 uVar1;
  undefined8 uVar2;
  sysbvm_tuple_t sVar3;
  undefined1 local_68 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_40_5_4e3b111d gcFrame;
  sysbvm_tuple_t astNode__local;
  sysbvm_functionBytecodeDirectCompiler_t *compiler__local;
  sysbvm_context_t *context_local;
  
  gcFrameRecord.roots = (sysbvm_tuple_t *)compiler_;
  memset(local_68,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_68);
  uVar1 = *(undefined8 *)(gcFrameRecord.roots[2] + 0x58);
  uVar2 = *(undefined8 *)(gcFrameRecord.roots[2] + 0x68);
  sVar3 = sysbvm_astNode_getSourcePosition(astNode_);
  *(sysbvm_tuple_t *)(gcFrameRecord.roots[2] + 0x58) = sVar3;
  *(sysbvm_tuple_t *)(gcFrameRecord.roots[2] + 0x68) = astNode_;
  sVar3 = sysbvm_tuple_send1(context,(context->roots).astNodeCompileIntoBytecodeSelector,astNode_,
                             (sysbvm_tuple_t)gcFrameRecord.roots);
  *(undefined8 *)(gcFrameRecord.roots[2] + 0x58) = uVar1;
  *(undefined8 *)(gcFrameRecord.roots[2] + 0x68) = uVar2;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_68);
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeDirectCompiler_compileASTNode(sysbvm_context_t *context, sysbvm_functionBytecodeDirectCompiler_t *compiler_, sysbvm_tuple_t astNode_)
{
    struct {
        sysbvm_functionBytecodeDirectCompiler_t *compiler;
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t result;

        sysbvm_tuple_t oldSourcePosition;
        sysbvm_tuple_t oldSourceASTNode;
    } gcFrame = {
        .compiler = compiler_,
        .astNode = astNode_
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.oldSourcePosition = gcFrame.compiler->assembler->sourcePosition;
    gcFrame.oldSourceASTNode = gcFrame.compiler->assembler->sourceASTNode;

    gcFrame.compiler->assembler->sourcePosition = sysbvm_astNode_getSourcePosition(gcFrame.astNode);
    gcFrame.compiler->assembler->sourceASTNode = gcFrame.astNode;

    gcFrame.result = sysbvm_tuple_send1(context, context->roots.astNodeCompileIntoBytecodeSelector, gcFrame.astNode, (sysbvm_tuple_t)gcFrame.compiler);

    gcFrame.compiler->assembler->sourcePosition = gcFrame.oldSourcePosition;
    gcFrame.compiler->assembler->sourceASTNode = gcFrame.oldSourceASTNode;

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}